

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * sqlite3_update_hook(sqlite3 *db,
                          _func_void_void_ptr_int_char_ptr_char_ptr_sqlite_int64 *xCallback,
                          void *pArg)

{
  void *pvVar1;
  sqlite3_mutex *psVar2;
  
  if (db->mutex == (sqlite3_mutex *)0x0) {
    psVar2 = (sqlite3_mutex *)0x0;
  }
  else {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    psVar2 = db->mutex;
  }
  pvVar1 = db->pUpdateArg;
  db->xUpdateCallback = xCallback;
  db->pUpdateArg = pArg;
  if (psVar2 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar2);
  }
  return pvVar1;
}

Assistant:

SQLITE_API void *sqlite3_update_hook(
  sqlite3 *db,              /* Attach the hook to this database */
  void (*xCallback)(void*,int,char const *,char const *,sqlite_int64),
  void *pArg                /* Argument to the function */
){
  void *pRet;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  pRet = db->pUpdateArg;
  db->xUpdateCallback = xCallback;
  db->pUpdateArg = pArg;
  sqlite3_mutex_leave(db->mutex);
  return pRet;
}